

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_source_generator_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::SourceGeneratorBase::class_access_level_abi_cxx11_
          (string *__return_storage_ptr__,SourceGeneratorBase *this)

{
  bool bVar1;
  char *pcVar2;
  allocator local_11;
  
  bVar1 = IsDescriptorProto(this->descriptor_);
  if (bVar1) {
    pcVar2 = "internal";
  }
  else {
    pcVar2 = "public";
    if (this->options_->internal_access != false) {
      pcVar2 = "internal";
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceGeneratorBase::class_access_level() {
  return (IsDescriptorProto(descriptor_) || this->options()->internal_access) ? "internal" : "public";
}